

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O0

VNode * despot::DESPOT::Prune(VNode *vnode,ACT_TYPE *pruned_action,double *pruned_value)

{
  QNode *pQVar1;
  QNode *pQVar2;
  int depth;
  VNode *pVVar3;
  OBS_TYPE edge;
  ulong uVar4;
  size_type sVar5;
  reference ppQVar6;
  QNode *pQVar7;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  double dVar8;
  ValuedAction VVar9;
  QNode *pruned_q;
  double nu;
  QNode *qnode;
  QNode *pQStack_70;
  int i;
  QNode *qstar;
  double nustar;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvStack_58;
  ACT_TYPE astar;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *children;
  VNode *local_40;
  VNode *pruned_v;
  vector<despot::State_*,_std::allocator<despot::State_*>_> empty;
  double *pruned_value_local;
  ACT_TYPE *pruned_action_local;
  VNode *vnode_local;
  
  empty.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pruned_value;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&pruned_v);
  pVVar3 = (VNode *)operator_new(0x98);
  depth = VNode::depth(vnode);
  edge = VNode::edge(vnode);
  VNode::VNode(pVVar3,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)&pruned_v,depth,
               (QNode *)0x0,edge);
  local_40 = pVVar3;
  pvStack_58 = VNode::children(vnode);
  nustar._4_4_ = -1;
  qstar = (QNode *)0xfff0000000000000;
  pQStack_70 = (QNode *)0x0;
  for (qnode._4_4_ = 0; uVar4 = (ulong)qnode._4_4_,
      sVar5 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(pvStack_58),
      pQVar7 = qstar, uVar4 < sVar5; qnode._4_4_ = qnode._4_4_ + 1) {
    ppQVar6 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                        (pvStack_58,(long)qnode._4_4_);
    nu = (double)*ppQVar6;
    pQVar7 = Prune((QNode *)nu,(double *)&pruned_q);
    if ((double)pruned_q <= (double)qstar) {
      pQVar2 = pQStack_70;
      if (pQVar7 != (QNode *)0x0) {
        QNode::~QNode(pQVar7);
        operator_delete(pQVar7,0x88);
        pQVar2 = pQStack_70;
      }
    }
    else {
      qstar = pruned_q;
      nustar._4_4_ = QNode::edge((QNode *)nu);
      pQVar1 = pQStack_70;
      pQVar2 = pQVar7;
      if ((pQStack_70 != (QNode *)0x0) && (pQStack_70 != (QNode *)0x0)) {
        QNode::~QNode(pQStack_70);
        operator_delete(pQVar1,0x88);
      }
    }
    pQStack_70 = pQVar2;
  }
  VVar9 = VNode::default_move(vnode);
  if (VVar9.value <= (double)pQVar7) {
    this = VNode::children(local_40);
    std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::push_back
              (this,&stack0xffffffffffffff90);
    QNode::parent(pQStack_70,local_40);
  }
  else {
    VVar9 = VNode::default_move(vnode);
    qstar = (QNode *)VVar9.value;
    VVar9 = VNode::default_move(vnode);
    pQVar7 = pQStack_70;
    nustar._4_4_ = VVar9.action;
    if (pQStack_70 != (QNode *)0x0) {
      QNode::~QNode(pQStack_70);
      operator_delete(pQVar7,0x88);
    }
  }
  pVVar3 = local_40;
  dVar8 = VNode::lower_bound(vnode);
  VNode::lower_bound(pVVar3,dVar8);
  pVVar3 = local_40;
  dVar8 = VNode::upper_bound(vnode);
  VNode::upper_bound(pVVar3,dVar8);
  pVVar3 = local_40;
  *pruned_action = nustar._4_4_;
  *empty.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = (State *)qstar;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&pruned_v);
  return pVVar3;
}

Assistant:

VNode* DESPOT::Prune(VNode* vnode, ACT_TYPE& pruned_action, double& pruned_value) {
	vector<State*> empty;
	VNode* pruned_v = new VNode(empty, vnode->depth(), NULL,
		vnode->edge());

	vector<QNode*>& children = vnode->children();
	ACT_TYPE astar = -1;
	double nustar = Globals::NEG_INFTY;
	QNode* qstar = NULL;
	for (int i = 0; i < children.size(); i++) {
		QNode* qnode = children[i];
		double nu;
		QNode* pruned_q = Prune(qnode, nu);

		if (nu > nustar) {
			nustar = nu;
			astar = qnode->edge();

			if (qstar != NULL) {
				delete qstar;
			}

			qstar = pruned_q;
		} else {
			delete pruned_q;
		}
	}

	if (nustar < vnode->default_move().value) {
		nustar = vnode->default_move().value;
		astar = vnode->default_move().action;
		delete qstar;
	} else {
		pruned_v->children().push_back(qstar);
		qstar->parent(pruned_v);
	}

	pruned_v->lower_bound(vnode->lower_bound()); // for debugging
	pruned_v->upper_bound(vnode->upper_bound());

	pruned_action = astar;
	pruned_value = nustar;

	return pruned_v;
}